

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O2

int Ree_ManCountFadds(Vec_Int_t *vAdds)

{
  int iVar1;
  int Count;
  int iVar2;
  int i;
  
  iVar2 = 0;
  for (i = 2; i + -2 < vAdds->nSize; i = i + 6) {
    iVar1 = Vec_IntEntry(vAdds,i);
    iVar2 = (iVar2 + 1) - (uint)(iVar1 == 0);
  }
  return iVar2;
}

Assistant:

int Ree_ManCountFadds( Vec_Int_t * vAdds )
{
    int i, Count = 0;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
        if ( Vec_IntEntry(vAdds, 6*i+2) != 0 )
            Count++;
    return Count;
}